

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  long *ilimit_w;
  long *iEnd;
  long *iStart;
  long *plVar1;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_longLengthType_e ZVar7;
  BYTE *pBVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  BYTE *pBVar11;
  int *op;
  uint uVar12;
  int iVar13;
  undefined8 uVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  size_t sVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  long *plVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  U32 UVar28;
  uint uVar29;
  ulong uVar30;
  BYTE *pBVar31;
  BYTE *pBVar32;
  uint uVar33;
  long *plVar34;
  seqDef *psVar35;
  U32 UVar36;
  BYTE *litEnd;
  long *iend;
  int iVar37;
  long *plVar38;
  BYTE *pBVar39;
  long *plVar40;
  uint local_104;
  uint local_f8;
  BYTE *litLimit_w;
  
  iEnd = (long *)((long)src + srcSize);
  pBVar8 = (ms->window).base;
  iVar27 = (int)pBVar8;
  iVar37 = (int)iEnd - iVar27;
  uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar5 = (ms->window).lowLimit;
  uVar12 = iVar37 - uVar16;
  if (iVar37 - uVar5 <= uVar16) {
    uVar12 = uVar5;
  }
  if (ms->loadedDictEnd != 0) {
    uVar12 = uVar5;
  }
  uVar5 = (ms->window).dictLimit;
  if (uVar5 <= uVar12) {
    sVar18 = ZSTD_compressBlock_doubleFast(ms,seqStore,rep,src,srcSize);
    return sVar18;
  }
  pUVar9 = ms->hashTable;
  pUVar10 = ms->chainTable;
  plVar3 = (long *)((long)src + (srcSize - 8));
  pBVar11 = (ms->window).dictBase;
  iStart = (long *)(pBVar8 + uVar5);
  plVar1 = (long *)(pBVar11 + uVar12);
  plVar2 = (long *)(pBVar11 + uVar5);
  local_104 = *rep;
  local_f8 = rep[1];
  uVar16 = (ms->cParams).chainLog;
  uVar6 = (ms->cParams).hashLog;
  cVar15 = (char)uVar16;
  bVar19 = 0x40 - cVar15;
  bVar20 = 0x20 - cVar15;
  bVar21 = 0x40 - (char)uVar6;
  ilimit_w = iEnd + -4;
  plVar22 = (long *)src;
LAB_001b7001:
  do {
    if (plVar3 <= src) {
      *rep = local_104;
      rep[1] = local_f8;
      return (long)iEnd - (long)plVar22;
    }
    if (0x20 < uVar16) goto LAB_001b7cc3;
    uVar23 = (ulong)(mls - 5);
    switch(uVar23) {
    case 0:
      lVar26 = -0x30e4432345000000;
      break;
    case 1:
      lVar26 = -0x30e4432340650000;
      break;
    case 2:
      lVar26 = -0x30e44323405a9d00;
      break;
    case 3:
      uVar24 = *src * -0x30e44323485a9b9d;
      goto LAB_001b7074;
    default:
      uVar24 = (ulong)((uint)((int)*src * -0x61c8864f) >> (bVar20 & 0x1f));
      goto LAB_001b707c;
    }
    uVar24 = lVar26 * *src;
LAB_001b7074:
    uVar24 = uVar24 >> (bVar19 & 0x3f);
LAB_001b707c:
    uVar33 = pUVar10[uVar24];
    pBVar32 = pBVar8;
    if (uVar33 < uVar5) {
      pBVar32 = pBVar11;
    }
    if (0x20 < uVar6) {
LAB_001b7cc3:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    lVar26 = *src;
    uVar30 = (ulong)(lVar26 * -0x30e44323485a9b9d) >> (bVar21 & 0x3f);
    uVar29 = pUVar9[uVar30];
    pBVar39 = pBVar8;
    if (uVar29 < uVar5) {
      pBVar39 = pBVar11;
    }
    UVar36 = (int)src - iVar27;
    pUVar9[uVar30] = UVar36;
    UVar28 = UVar36 + 1;
    pUVar10[uVar24] = UVar36;
    if ((local_104 <= UVar28 - uVar12) && (uVar17 = UVar28 - local_104, 2 < (uVar5 - 1) - uVar17)) {
      pBVar31 = pBVar8;
      if (uVar17 < uVar5) {
        pBVar31 = pBVar11;
      }
      if (*(int *)(pBVar31 + uVar17) != *(int *)((long)src + 1)) goto LAB_001b7120;
      plVar40 = iEnd;
      if (uVar17 < uVar5) {
        plVar40 = plVar2;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 5),pBVar31 + (ulong)uVar17 + 4,(BYTE *)iEnd,
                          (BYTE *)plVar40,(BYTE *)iStart);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001b7d5e;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001b7d3f;
      iend = (long *)((long)src + 1);
      uVar30 = (long)iend - (long)plVar22;
      plVar40 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar40 + uVar30))
      goto LAB_001b7d01;
      if (iEnd < iend) goto LAB_001b7d20;
      if (ilimit_w < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar40,(BYTE *)plVar22,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_001b7231:
        seqStore->lit = seqStore->lit + uVar30;
        if (0xffff < uVar30) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b7d9c;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar26 = plVar22[1];
        *plVar40 = *plVar22;
        plVar40[1] = lVar26;
        pBVar32 = seqStore->lit;
        if (0x10 < uVar30) {
          if (0xffffffffffffffe0 < (ulong)((long)(pBVar32 + 0x10) + (-0x10 - (long)(plVar22 + 2))))
          goto LAB_001b7df9;
          lVar26 = plVar22[3];
          *(long *)(pBVar32 + 0x10) = plVar22[2];
          *(long *)(pBVar32 + 0x18) = lVar26;
          if (0x20 < (long)uVar30) {
            lVar26 = 0;
            do {
              puVar4 = (undefined8 *)((long)plVar22 + lVar26 + 0x20);
              uVar14 = puVar4[1];
              pBVar39 = pBVar32 + lVar26 + 0x20;
              *(undefined8 *)pBVar39 = *puVar4;
              *(undefined8 *)(pBVar39 + 8) = uVar14;
              puVar4 = (undefined8 *)((long)plVar22 + lVar26 + 0x30);
              uVar14 = puVar4[1];
              *(undefined8 *)(pBVar39 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar39 + 0x18) = uVar14;
              lVar26 = lVar26 + 0x20;
            } while (pBVar39 + 0x20 < pBVar32 + uVar30);
          }
          goto LAB_001b7231;
        }
        seqStore->lit = pBVar32 + uVar30;
      }
      uVar24 = sVar18 + 4;
      psVar35 = seqStore->sequences;
      psVar35->litLength = (U16)uVar30;
      psVar35->offBase = 1;
      if (uVar24 < 3) goto LAB_001b7ce2;
      uVar30 = sVar18 + 1;
      if (uVar30 < 0x10000) goto LAB_001b78da;
      ZVar7 = seqStore->longLengthType;
      uVar29 = local_104;
joined_r0x001b76e0:
      if (ZVar7 != ZSTD_llt_none) {
LAB_001b7d7d:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
      local_104 = uVar29;
LAB_001b78da:
      src = (void *)(uVar24 + (long)iend);
      psVar35->mlBase = (U16)uVar30;
      psVar35 = psVar35 + 1;
      seqStore->sequences = psVar35;
      plVar22 = (long *)src;
      if (src <= plVar3) {
        uVar33 = UVar36 + 2;
        lVar26 = *(long *)(pBVar8 + uVar33);
        uVar24 = lVar26 * -0x30e44323485a9b9d;
        pUVar9[uVar24 >> (bVar21 & 0x3f)] = uVar33;
        pUVar9[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar21 & 0x3f)] =
             ((int)src + -2) - iVar27;
        switch(uVar23) {
        case 0:
          lVar25 = -0x30e4432345000000;
          break;
        case 1:
          lVar25 = -0x30e4432340650000;
          break;
        case 2:
          lVar25 = -0x30e44323405a9d00;
          break;
        case 3:
          pUVar10[uVar24 >> (bVar19 & 0x3f)] = uVar33;
          uVar24 = *(long *)((long)src + -1) * -0x30e44323485a9b9d;
          goto LAB_001b79cf;
        default:
          pUVar10[(uint)(*(int *)(pBVar8 + uVar33) * -0x61c8864f) >> (bVar20 & 0x1f)] = uVar33;
          uVar24 = (ulong)((uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar20 & 0x1f));
          goto LAB_001b79d2;
        }
        pUVar10[(ulong)(lVar26 * lVar25) >> (bVar19 & 0x3f)] = uVar33;
        uVar24 = lVar25 * *(long *)((long)src + -1);
LAB_001b79cf:
        uVar24 = uVar24 >> (bVar19 & 0x3f);
LAB_001b79d2:
        pUVar10[uVar24] = ((int)src + -1) - iVar27;
        uVar33 = local_104;
        for (; local_104 = uVar33, plVar22 = (long *)src, src <= plVar3;
            src = (void *)((long)src + sVar18 + 4)) {
          UVar28 = (int)src - iVar27;
          uVar33 = UVar28 - local_f8;
          pBVar32 = pBVar8;
          if (uVar33 < uVar5) {
            pBVar32 = pBVar11;
          }
          if (((UVar28 - uVar12 < local_f8) || ((uVar5 - 1) - uVar33 < 3)) ||
             (*(int *)(pBVar32 + uVar33) != (int)*src)) break;
          plVar22 = iEnd;
          if (uVar33 < uVar5) {
            plVar22 = plVar2;
          }
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar32 + uVar33) + 4),
                              (BYTE *)iEnd,(BYTE *)plVar22,(BYTE *)iStart);
          if (seqStore->maxNbSeq <= (ulong)((long)psVar35 - (long)seqStore->sequencesStart >> 3))
          goto LAB_001b7d5e;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001b7d3f;
          op = (int *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < op) goto LAB_001b7d01;
          if (iEnd < src) goto LAB_001b7d20;
          if (ilimit_w < src) {
            ZSTD_safecopyLiterals((BYTE *)op,(BYTE *)src,(BYTE *)src,(BYTE *)ilimit_w);
          }
          else {
            iVar37 = *(int *)((long)src + 4);
            lVar26 = *(long *)((long)src + 8);
            iVar13 = *(int *)((long)src + 0xc);
            *op = (int)*src;
            op[1] = iVar37;
            op[2] = (int)lVar26;
            op[3] = iVar13;
          }
          psVar35 = seqStore->sequences;
          psVar35->litLength = 0;
          psVar35->offBase = 1;
          if (sVar18 + 4 < 3) goto LAB_001b7ce2;
          if (0xffff < sVar18 + 1) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b7d7d;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar35->mlBase = (U16)(sVar18 + 1);
          psVar35 = psVar35 + 1;
          seqStore->sequences = psVar35;
          if (mls - 5 < 4) {
            sVar18 = (*(code *)(&DAT_00245adc + *(int *)(&DAT_00245adc + uVar23 * 4)))();
            return sVar18;
          }
          lVar26 = *src;
          pUVar10[(uint)((int)*src * -0x61c8864f) >> (bVar20 & 0x1f)] = UVar28;
          pUVar9[(ulong)(lVar26 * -0x30e44323485a9b9d) >> (bVar21 & 0x3f)] = UVar28;
          uVar33 = local_f8;
          local_f8 = local_104;
        }
      }
      goto LAB_001b7001;
    }
LAB_001b7120:
    if ((uVar12 < uVar29) && (plVar40 = (long *)(pBVar39 + uVar29), *plVar40 == lVar26)) {
      plVar34 = iStart;
      plVar38 = iEnd;
      if (uVar29 < uVar5) {
        plVar34 = plVar1;
        plVar38 = plVar2;
      }
      sVar18 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 8),(BYTE *)(plVar40 + 1),(BYTE *)iEnd,(BYTE *)plVar38
                          ,(BYTE *)iStart);
      uVar29 = UVar36 - uVar29;
      for (lVar26 = 0;
          ((iend = (long *)((long)src + lVar26), plVar34 < (long *)((long)plVar40 + lVar26) &&
           (plVar22 < iend)) &&
          (*(char *)((long)src + lVar26 + -1) == *(char *)((long)plVar40 + lVar26 + -1)));
          lVar26 = lVar26 + -1) {
      }
      if (uVar29 == 0) {
        __assert_fail("(offset)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                      ,0x295,
                      "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001b7d5e:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
LAB_001b7d3f:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar24 = (long)src + (lVar26 - (long)plVar22);
      plVar40 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar40 + uVar24)) {
LAB_001b7d01:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      plVar38 = (long *)(uVar24 + (long)plVar22);
      if (iEnd < plVar38) {
LAB_001b7d20:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit_w < plVar38) {
        ZSTD_safecopyLiterals((BYTE *)plVar40,(BYTE *)plVar22,(BYTE *)plVar38,(BYTE *)ilimit_w);
LAB_001b7371:
        seqStore->lit = seqStore->lit + (long)src + (lVar26 - (long)plVar22);
        if (0xffff < uVar24) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001b7d9c:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar25 = plVar22[1];
        *plVar40 = *plVar22;
        plVar40[1] = lVar25;
        pBVar32 = seqStore->lit;
        if (0x10 < uVar24) {
          if (0xffffffffffffffe0 < (ulong)((long)(pBVar32 + 0x10) + (-0x10 - (long)(plVar22 + 2))))
          {
LAB_001b7df9:
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          lVar25 = plVar22[3];
          *(long *)(pBVar32 + 0x10) = plVar22[2];
          *(long *)(pBVar32 + 0x18) = lVar25;
          if (0x20 < (long)uVar24) {
            lVar25 = 0;
            do {
              puVar4 = (undefined8 *)((long)plVar22 + lVar25 + 0x20);
              uVar14 = puVar4[1];
              pBVar39 = pBVar32 + lVar25 + 0x20;
              *(undefined8 *)pBVar39 = *puVar4;
              *(undefined8 *)(pBVar39 + 8) = uVar14;
              puVar4 = (undefined8 *)((long)plVar22 + lVar25 + 0x30);
              uVar14 = puVar4[1];
              *(undefined8 *)(pBVar39 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar39 + 0x18) = uVar14;
              lVar25 = lVar25 + 0x20;
            } while (pBVar39 + 0x20 < pBVar32 + uVar24);
          }
          goto LAB_001b7371;
        }
        seqStore->lit = pBVar32 + uVar24;
      }
      uVar24 = (sVar18 - lVar26) + 8;
      psVar35 = seqStore->sequences;
      psVar35->litLength = (short)lVar26 + ((short)src - (short)plVar22);
      psVar35->offBase = uVar29 + 3;
      if (uVar24 < 3) {
LAB_001b7ce2:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar30 = (sVar18 - lVar26) + 5;
      if (0xffff < uVar30) {
        ZVar7 = seqStore->longLengthType;
        local_f8 = local_104;
        goto joined_r0x001b76e0;
      }
      local_f8 = local_104;
      local_104 = uVar29;
      goto LAB_001b78da;
    }
    if ((uVar12 < uVar33) && (plVar40 = (long *)(pBVar32 + uVar33), (int)*plVar40 == (int)*src)) {
      lVar26 = *(long *)((long)src + 1);
      uVar24 = (ulong)(lVar26 * -0x30e44323485a9b9d) >> (bVar21 & 0x3f);
      uVar29 = pUVar9[uVar24];
      pBVar32 = pBVar8;
      if (uVar29 < uVar5) {
        pBVar32 = pBVar11;
      }
      pUVar9[uVar24] = UVar28;
      if ((uVar12 < uVar29) && (plVar38 = (long *)(pBVar32 + uVar29), *plVar38 == lVar26)) {
        iend = (long *)((long)src + 1);
        plVar34 = iStart;
        plVar40 = iEnd;
        if (uVar29 < uVar5) {
          plVar34 = plVar1;
          plVar40 = plVar2;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 9),(BYTE *)(plVar38 + 1),(BYTE *)iEnd,
                            (BYTE *)plVar40,(BYTE *)iStart);
        uVar24 = sVar18 + 8;
        uVar29 = UVar28 - uVar29;
        for (; ((plVar34 < plVar38 && (plVar22 < iend)) &&
               (*(BYTE *)((long)iend + -1) == *(BYTE *)((long)plVar38 + -1)));
            iend = (long *)((long)iend + -1)) {
          plVar38 = (long *)((long)plVar38 + -1);
          uVar24 = uVar24 + 1;
        }
      }
      else {
        plVar34 = iStart;
        plVar38 = iEnd;
        if (uVar33 < uVar5) {
          plVar34 = plVar1;
          plVar38 = plVar2;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)((long)plVar40 + 4),(BYTE *)iEnd,
                            (BYTE *)plVar38,(BYTE *)iStart);
        uVar24 = sVar18 + 4;
        uVar29 = UVar36 - uVar33;
        for (; ((iend = (long *)src, plVar34 < plVar40 && (plVar22 < src)) &&
               (*(BYTE *)((long)src + -1) == *(BYTE *)((long)plVar40 + -1)));
            src = (void *)((long)src + -1)) {
          plVar40 = (long *)((long)plVar40 + -1);
          uVar24 = uVar24 + 1;
        }
      }
      if (uVar29 == 0) {
        __assert_fail("(offset)>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                      ,0x2ae,
                      "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_001b7d5e;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001b7d3f;
      uVar30 = (long)iend - (long)plVar22;
      plVar40 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar40 + uVar30))
      goto LAB_001b7d01;
      if (iEnd < iend) goto LAB_001b7d20;
      if (ilimit_w < iend) {
        ZSTD_safecopyLiterals((BYTE *)plVar40,(BYTE *)plVar22,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_001b7792:
        seqStore->lit = seqStore->lit + uVar30;
        if (0xffff < uVar30) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001b7d9c;
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        lVar26 = plVar22[1];
        *plVar40 = *plVar22;
        plVar40[1] = lVar26;
        pBVar32 = seqStore->lit;
        if (0x10 < uVar30) {
          if (0xffffffffffffffe0 < (ulong)((long)(pBVar32 + 0x10) + (-0x10 - (long)(plVar22 + 2))))
          goto LAB_001b7df9;
          lVar26 = plVar22[3];
          *(long *)(pBVar32 + 0x10) = plVar22[2];
          *(long *)(pBVar32 + 0x18) = lVar26;
          if (0x20 < (long)uVar30) {
            lVar26 = 0;
            do {
              puVar4 = (undefined8 *)((long)plVar22 + lVar26 + 0x20);
              uVar14 = puVar4[1];
              pBVar39 = pBVar32 + lVar26 + 0x20;
              *(undefined8 *)pBVar39 = *puVar4;
              *(undefined8 *)(pBVar39 + 8) = uVar14;
              puVar4 = (undefined8 *)((long)plVar22 + lVar26 + 0x30);
              uVar14 = puVar4[1];
              *(undefined8 *)(pBVar39 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar39 + 0x18) = uVar14;
              lVar26 = lVar26 + 0x20;
            } while (pBVar39 + 0x20 < pBVar32 + uVar30);
          }
          goto LAB_001b7792;
        }
        seqStore->lit = pBVar32 + uVar30;
      }
      psVar35 = seqStore->sequences;
      psVar35->litLength = (U16)uVar30;
      psVar35->offBase = uVar29 + 3;
      if (uVar24 < 3) goto LAB_001b7ce2;
      uVar30 = uVar24 - 3;
      if (0xffff < uVar30) {
        ZVar7 = seqStore->longLengthType;
        local_f8 = local_104;
        goto joined_r0x001b76e0;
      }
      local_f8 = local_104;
      local_104 = uVar29;
      goto LAB_001b78da;
    }
    src = (void *)((long)src + ((long)src - (long)plVar22 >> 8) + 1);
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast(ms, seqStore, rep, src, srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 <= curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, REPCODE1_TO_OFFBASE, mLength);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 <= current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}